

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  int iVar1;
  ulong body_size_00;
  long in_RDX;
  byte *in_RSI;
  long *in_RDI;
  size_t body_size;
  size_t body_start;
  int ret;
  uint8_t *end;
  uint8_t *p;
  size_t in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  ptls_buffer_t *in_stack_ffffffffffffffc8;
  ptls_buffer_t *buf_00;
  int local_2c;
  byte *local_20;
  
  for (local_20 = in_RSI; (0 < (long)(in_RSI + in_RDX) - (long)local_20 && (*local_20 == 0));
      local_20 = local_20 + 1) {
  }
  local_2c = ptls_buffer__do_pushv
                       (in_stack_ffffffffffffffc8,
                        (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
  if ((local_2c == 0) &&
     (local_2c = ptls_buffer__do_pushv
                           (in_stack_ffffffffffffffc8,
                            (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8), local_2c == 0)) {
    buf_00 = (ptls_buffer_t *)in_RDI[2];
    if (0x7f < *local_20) {
      in_stack_ffffffffffffffc7 = 0;
      iVar1 = ptls_buffer__do_pushv
                        (buf_00,(void *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (local_20 == in_RSI + in_RDX) {
      local_2c = ptls_buffer__do_pushv
                           (buf_00,(void *)CONCAT17(in_stack_ffffffffffffffc7,
                                                    in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
    }
    else {
      local_2c = ptls_buffer__do_pushv
                           (buf_00,(void *)CONCAT17(in_stack_ffffffffffffffc7,
                                                    in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
    }
    if (local_2c == 0) {
      body_size_00 = in_RDI[2] - (long)buf_00;
      if (body_size_00 < 0x80) {
        *(char *)((long)buf_00 + *in_RDI + -1) = (char)body_size_00;
      }
      else {
        iVar1 = ptls_buffer__adjust_asn1_blocksize
                          ((ptls_buffer_t *)
                           CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                           body_size_00);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      local_2c = 0;
    }
  }
  return local_2c;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *const end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}